

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiefiltermodel.h
# Opt level: O0

void __thiscall rlottie::internal::model::FilterData::addValue(FilterData *this,LOTVariant *value)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  anon_class_8_1_a8c68091 in_RSI;
  LOTVariant *in_RDI;
  uint32_t index;
  bitset<32UL> *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffd8;
  vector<LOTVariant,_std::allocator<LOTVariant>_> *in_stack_ffffffffffffffe0;
  
  LOTVariant::property(in_RSI.value);
  bVar1 = std::bitset<32UL>::test(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  if (bVar1) {
    __first = std::vector<LOTVariant,_std::allocator<LOTVariant>_>::begin(in_RDI);
    __last = std::vector<LOTVariant,_std::allocator<LOTVariant>_>::end(in_RDI);
    std::
    replace_if<__gnu_cxx::__normal_iterator<LOTVariant*,std::vector<LOTVariant,std::allocator<LOTVariant>>>,rlottie::internal::model::FilterData::addValue(LOTVariant&)::_lambda(LOTVariant_const&)_1_,LOTVariant>
              ((__normal_iterator<LOTVariant_*,_std::vector<LOTVariant,_std::allocator<LOTVariant>_>_>
                )__first._M_current,
               (__normal_iterator<LOTVariant_*,_std::vector<LOTVariant,_std::allocator<LOTVariant>_>_>
                )__last._M_current,in_RSI,in_RDI);
  }
  else {
    std::bitset<32UL>::set
              ((bitset<32UL> *)in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8,
               SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
    std::vector<LOTVariant,_std::allocator<LOTVariant>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void addValue(LOTVariant& value)
    {
        uint32_t index = static_cast<uint32_t>(value.property());
        if (mBitset.test(index)) {
            std::replace_if(mFilters.begin(), mFilters.end(),
                            [&value](const LOTVariant& e) {
                                return e.property() == value.property();
                            },
                            value);
        } else {
            mBitset.set(index);
            mFilters.push_back(value);
        }
    }